

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void xmlMutexUnlock(xmlMutexPtr tok)

{
  if (tok == (xmlMutexPtr)0x0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)tok);
  return;
}

Assistant:

void
xmlMutexUnlock(xmlMutexPtr tok)
{
    if (tok == NULL)
        return;
#ifdef HAVE_POSIX_THREADS
    pthread_mutex_unlock(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    LeaveCriticalSection(&tok->cs);
#endif
}